

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O0

void __thiscall Json::Value::Value(Value *this,char *value)

{
  char *pcVar1;
  char *value_local;
  Value *this_local;
  
  *(ushort *)&this->field_0x8 = *(ushort *)&this->field_0x8 & 0xff00 | 4;
  *(ushort *)&this->field_0x8 = *(ushort *)&this->field_0x8 & 0xfeff | 0x100;
  this->comments_ = (CommentInfo *)0x0;
  pcVar1 = duplicateStringValue(value,0xffffffff);
  (this->value_).string_ = pcVar1;
  return;
}

Assistant:

Value::Value( const char *value )
   : type_( stringValue )
   , allocated_( true )
# ifdef JSON_VALUE_USE_INTERNAL_MAP
   , itemIsUsed_( 0 )
#endif
   , comments_( 0 )
{
   value_.string_ = duplicateStringValue( value );
}